

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

cmCPackGenerator * cmCPackArchiveGenerator::CreateTZSTGenerator(void)

{
  cmCPackArchiveGenerator *this;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  this = (cmCPackArchiveGenerator *)operator_new(0x1b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"paxr",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,".tar.zst",&local_52);
  cmCPackArchiveGenerator(this,CompressZstd,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return &this->super_cmCPackGenerator;
}

Assistant:

cmCPackGenerator* cmCPackArchiveGenerator::CreateTZSTGenerator()
{
  return new cmCPackArchiveGenerator(cmArchiveWrite::CompressZstd, "paxr",
                                     ".tar.zst");
}